

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,char *targetDir,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  cmMakefile *this_00;
  bool bVar1;
  Encoding EVar2;
  char *pcVar3;
  cmDependsC *this_01;
  undefined4 uVar4;
  pointer pbVar5;
  allocator local_595;
  undefined4 local_594;
  char *local_590;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  string lang;
  string dir;
  string internalRuleFileNameFull;
  string ruleFileNameFull;
  string dirInfoFile;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_590 = targetDir;
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&dirInfoFile,pcVar3,(allocator *)&ruleFileStream);
  std::__cxx11::string::append((char *)&dirInfoFile);
  std::__cxx11::string::append((char *)&dirInfoFile);
  bVar1 = cmMakefile::ReadListFile(this_00,dirInfoFile._M_dataplus._M_p);
  if (bVar1) {
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&ruleFileStream,"CMAKE_FORCE_UNIX_PATHS",
                 (allocator *)&internalRuleFileStream);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (pcVar3 != (char *)0x0) {
        bVar1 = cmSystemTools::IsOff(pcVar3);
        if (!bVar1) {
          cmSystemTools::s_ForceUnixPaths = true;
        }
      }
      std::__cxx11::string::string
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_SOURCE",
                 (allocator *)&internalRuleFileStream);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (pcVar3 != (char *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)&ruleFileStream,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
        cmStateDirectory::SetRelativePathTopSource((cmStateDirectory *)&ruleFileStream,pcVar3);
      }
      std::__cxx11::string::string
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_BINARY",
                 (allocator *)&internalRuleFileStream);
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (pcVar3 != (char *)0x0) {
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)&ruleFileStream,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
        cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)&ruleFileStream,pcVar3);
      }
      goto LAB_003b339e;
    }
  }
  cmSystemTools::Error("Directory Information file not found",(char *)0x0,(char *)0x0,(char *)0x0);
LAB_003b339e:
  std::__cxx11::string::string((string *)&dir,local_590,(allocator *)&ruleFileStream);
  std::__cxx11::string::string((string *)&ruleFileNameFull,(string *)&dir);
  std::__cxx11::string::append((char *)&ruleFileNameFull);
  EVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            (&ruleFileStream,ruleFileNameFull._M_dataplus._M_p,false,EVar2);
  cmGeneratedFileStream::SetCopyIfDifferent(&ruleFileStream,true);
  if (((&ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::string::string((string *)&internalRuleFileNameFull,(string *)&dir);
    std::__cxx11::string::append((char *)&internalRuleFileNameFull);
    EVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              (&internalRuleFileStream,internalRuleFileNameFull._M_dataplus._M_p,false,EVar2);
    bVar1 = ((&internalRuleFileStream.super_ofstream.
               super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)internalRuleFileStream.super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
            == 0;
    local_594 = (undefined4)
                CONCAT71((int7)((ulong)internalRuleFileStream.super_ofstream.
                                       super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream[-3] >> 8),bVar1);
    if (bVar1) {
      WriteDisclaimer(this,(ostream *)&ruleFileStream);
      WriteDisclaimer(this,(ostream *)&internalRuleFileStream);
      std::__cxx11::string::string((string *)&lang,"CMAKE_DEPENDS_LANGUAGES",(allocator *)&langs);
      pcVar3 = cmMakefile::GetSafeDefinition(this_00,&lang);
      std::__cxx11::string::~string((string *)&lang);
      langs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      langs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      langs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&lang,pcVar3,&local_595);
      cmSystemTools::ExpandListArgument(&lang,&langs,false);
      std::__cxx11::string::~string((string *)&lang);
      for (pbVar5 = langs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar5 != langs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
        std::__cxx11::string::string((string *)&lang,(string *)pbVar5);
        bVar1 = std::operator==(&lang,"C");
        if (bVar1) {
LAB_003b35aa:
          this_01 = (cmDependsC *)operator_new(0x5a8);
          cmDependsC::cmDependsC(this_01,(cmLocalGenerator *)this,local_590,&lang,validDeps);
LAB_003b35cf:
          (this_01->super_cmDepends).LocalGenerator = (cmLocalGenerator *)this;
          (this_01->super_cmDepends).FileComparison =
               ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               CMakeInstance->FileComparison;
          std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).Language);
          std::__cxx11::string::assign((char *)&(this_01->super_cmDepends).TargetDirectory);
          cmDepends::Write(&this_01->super_cmDepends,(ostream *)&ruleFileStream,
                           (ostream *)&internalRuleFileStream);
          (*(this_01->super_cmDepends)._vptr_cmDepends[1])(this_01);
        }
        else {
          bVar1 = std::operator==(&lang,"CXX");
          if (bVar1) goto LAB_003b35aa;
          bVar1 = std::operator==(&lang,"RC");
          if (bVar1) goto LAB_003b35aa;
          bVar1 = std::operator==(&lang,"ASM");
          if (bVar1) goto LAB_003b35aa;
          bVar1 = std::operator==(&lang,"CUDA");
          if (bVar1) goto LAB_003b35aa;
          bVar1 = std::operator==(&lang,"Fortran");
          if (bVar1) {
            this_01 = (cmDependsC *)operator_new(0x108);
            cmDependsFortran::cmDependsFortran((cmDependsFortran *)this_01,(cmLocalGenerator *)this)
            ;
            goto LAB_003b35cf;
          }
          bVar1 = std::operator==(&lang,"Java");
          if (bVar1) {
            this_01 = (cmDependsC *)operator_new(0xb0);
            cmDependsJava::cmDependsJava((cmDependsJava *)this_01);
            goto LAB_003b35cf;
          }
        }
        std::__cxx11::string::~string((string *)&lang);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&langs);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&internalRuleFileStream);
    std::__cxx11::string::~string((string *)&internalRuleFileNameFull);
    uVar4 = local_594;
  }
  else {
    uVar4 = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ruleFileStream);
  std::__cxx11::string::~string((string *)&ruleFileNameFull);
  std::__cxx11::string::~string((string *)&dir);
  std::__cxx11::string::~string((string *)&dirInfoFile);
  return SUB41(uVar4,0);
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  const char* targetDir,
  std::map<std::string, cmDepends::DependencyVector>& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  std::string dirInfoFile = this->GetCurrentBinaryDirectory();
  dirInfoFile += cmake::GetCMakeFilesDirectory();
  dirInfoFile += "/CMakeDirectoryInformation.cmake";
  if (mf->ReadListFile(dirInfoFile.c_str()) &&
      !cmSystemTools::GetErrorOccuredFlag()) {
    haveDirectoryInfo = true;
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (const char* force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmSystemTools::IsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    if (const char* relativePathTopSource =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopSource(
        relativePathTopSource);
    }
    if (const char* relativePathTopBinary =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopBinary(
        relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // create the file stream for the depends file
  std::string dir = targetDir;

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  std::string ruleFileNameFull = dir;
  ruleFileNameFull += "/depend.make";
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  std::string internalRuleFileNameFull = dir;
  internalRuleFileNameFull += "/depend.internal";
  cmGeneratedFileStream internalRuleFileStream(
    internalRuleFileNameFull.c_str(), false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  const char* langStr = mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES");
  std::vector<std::string> langs;
  cmSystemTools::ExpandListArgument(langStr, langs);
  for (std::vector<std::string>::iterator li = langs.begin();
       li != langs.end(); ++li) {
    // construct the checker
    std::string lang = *li;

    // Create the scanner for this language
    cmDepends* scanner = CM_NULLPTR;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "CUDA") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = new cmDependsC(this, targetDir, lang, &validDeps);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
    else if (lang == "Fortran") {
      scanner = new cmDependsFortran(this);
    } else if (lang == "Java") {
      scanner = new cmDependsJava();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileComparison(
        this->GlobalGenerator->GetCMakeInstance()->GetFileComparison());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(dir.c_str());
      scanner->Write(ruleFileStream, internalRuleFileStream);

      // free the scanner for this language
      delete scanner;
    }
  }

  return true;
}